

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppAssertTest.cpp
# Opt level: O0

void __thiscall
CppAssertTest_formatStatementAssertion_Test::TestBody
          (CppAssertTest_formatStatementAssertion_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_68;
  Message local_60 [3];
  int local_44;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  CppAssertTest_formatStatementAssertion_Test *this_local;
  
  cppassert::
  CppAssertI<cppassert::CppAssertT<cppassert::DefaultFormatter,std::mutex,cppassert::DefaultHandler>>
  ::formatStatementFailureMessage_abi_cxx11_
            ((string *)&gtest_ar.message_,(this->super_CppAssertTest).cppAssert_,(char *)0x0);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  local_44 = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_40,"1","formatStatementCounter_",&local_44,
             &(this->super_CppAssertTest).formatStatementCounter_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_60);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/CppAssertTest.cpp"
               ,0x9f,message);
    testing::internal::AssertHelper::operator=(&local_68,local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  return;
}

Assistant:

TEST_F(CppAssertTest, formatStatementAssertion)
{
    cppAssert_->formatStatementFailureMessage(nullptr);
    EXPECT_EQ(1, formatStatementCounter_);
}